

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<binlog::address,void_const*&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,address *args,void **args_1)

{
  Queue *pQVar1;
  size_t sVar2;
  char *pcVar3;
  
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < 0x24) {
    sVar2 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar2 < 0x24) &&
        (replaceChannel(this,0x24),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < 0x24)) &&
       (sVar2 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar2 < 0x24)) {
      return false;
    }
  }
  pcVar3 = (this->_qw)._writePos;
  pcVar3[0] = ' ';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 4;
  *(uint64_t *)(pcVar3 + 4) = eventSourceId;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(uint64_t *)(pcVar3 + 8) = clock;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(uint64_t *)(pcVar3 + 8) = args->value;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(void **)(pcVar3 + 8) = *args_1;
  pQVar1 = (this->_qw)._queue;
  pcVar3 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar3;
  (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar3 - (long)pQVar1->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}